

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O0

DSA * d2i_DSAPublicKey(DSA **a,uchar **pp,long length)

{
  uint8_t *puVar1;
  DSA *ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  DSA **out_local;
  
  if (length < 0) {
    out_local = (DSA **)0x0;
  }
  else {
    cbs.len = length;
    CBS_init((CBS *)&ret,*pp,length);
    out_local = (DSA **)DSA_parse_public_key((CBS *)&ret);
    if ((DSA *)out_local == (DSA *)0x0) {
      out_local = (DSA **)0x0;
    }
    else {
      if (a != (DSA **)0x0) {
        DSA_free(*a);
        *a = (DSA *)out_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *pp = puVar1;
    }
  }
  return (DSA *)out_local;
}

Assistant:

DSA *d2i_DSAPublicKey(DSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  DSA *ret = DSA_parse_public_key(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    DSA_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}